

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O0

void __thiscall
zstr::istreambuf::istreambuf
          (istreambuf *this,streambuf *_sbuf_p,size_t _buff_size,bool _auto_detect,int _window_bits)

{
  pointer pcVar1;
  pointer pcVar2;
  byte in_CL;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  undefined4 in_R8D;
  unique_ptr<char[],_std::default_delete<char[]>_> *in_stack_ffffffffffffff58;
  unique_ptr<char[],_std::default_delete<char[]>_> *in_stack_ffffffffffffff60;
  unique_ptr<char[],_std::default_delete<char[]>_> *this_00;
  unique_ptr<char[],_std::default_delete<char[]>_> local_40 [4];
  undefined4 local_20;
  byte local_19;
  undefined8 local_18;
  undefined8 local_10;
  
  local_19 = in_CL & 1;
  local_20 = in_R8D;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::streambuf::streambuf(in_RDI);
  *(undefined ***)in_RDI = &PTR__istreambuf_00895c10;
  *(undefined8 *)(in_RDI + 0x40) = local_10;
  std::unique_ptr<char[],std::default_delete<char[]>>::unique_ptr<std::default_delete<char[]>,void>
            (in_stack_ffffffffffffff60);
  in_RDI[0x50] = '\0';
  in_RDI[0x51] = '\0';
  in_RDI[0x52] = '\0';
  in_RDI[0x53] = '\0';
  in_RDI[0x54] = '\0';
  in_RDI[0x55] = '\0';
  in_RDI[0x56] = '\0';
  in_RDI[0x57] = '\0';
  in_RDI[0x58] = '\0';
  in_RDI[0x59] = '\0';
  in_RDI[0x5a] = '\0';
  in_RDI[0x5b] = '\0';
  in_RDI[0x5c] = '\0';
  in_RDI[0x5d] = '\0';
  in_RDI[0x5e] = '\0';
  in_RDI[0x5f] = '\0';
  std::unique_ptr<char[],std::default_delete<char[]>>::unique_ptr<std::default_delete<char[]>,void>
            (in_stack_ffffffffffffff60);
  std::
  unique_ptr<zstr::detail::z_stream_wrapper,std::default_delete<zstr::detail::z_stream_wrapper>>::
  unique_ptr<std::default_delete<zstr::detail::z_stream_wrapper>,void>
            ((unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
              *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  *(undefined8 *)(in_RDI + 0x70) = local_18;
  in_RDI[0x78] = local_19 & 1;
  in_RDI[0x79] = '\0';
  in_RDI[0x7a] = '\0';
  *(undefined4 *)(in_RDI + 0x7c) = local_20;
  operator_new__(*(ulong *)(in_RDI + 0x70));
  std::unique_ptr<char[],std::default_delete<char[]>>::
  unique_ptr<char*,std::default_delete<char[]>,void,bool>
            (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::operator=
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(in_stack_ffffffffffffff60);
  pcVar1 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(in_stack_ffffffffffffff60);
  *(pointer *)(in_RDI + 0x50) = pcVar1;
  pcVar1 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(in_stack_ffffffffffffff60);
  *(pointer *)(in_RDI + 0x58) = pcVar1;
  operator_new__(*(ulong *)(in_RDI + 0x70));
  this_00 = local_40;
  std::unique_ptr<char[],std::default_delete<char[]>>::
  unique_ptr<char*,std::default_delete<char[]>,void,bool>(this_00,(char *)in_stack_ffffffffffffff58)
  ;
  std::unique_ptr<char[],_std::default_delete<char[]>_>::operator=
            (this_00,in_stack_ffffffffffffff58);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(this_00);
  pcVar1 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(this_00);
  pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(this_00);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::get(this_00);
  std::streambuf::setg(in_RDI,pcVar1,pcVar2);
  return;
}

Assistant:

istreambuf(std::streambuf* _sbuf_p,
             std::size_t _buff_size = default_buff_size,
             bool _auto_detect = true, int _window_bits = 0)
      : sbuf_p(_sbuf_p),
        in_buff(),
        in_buff_start(nullptr),
        in_buff_end(nullptr),
        out_buff(),
        zstrm_p(nullptr),
        buff_size(_buff_size),
        auto_detect(_auto_detect),
        auto_detect_run(false),
        is_text(false),
        window_bits(_window_bits) {
    assert(sbuf_p);
    in_buff = std::unique_ptr<char[]>(new char[buff_size]);
    in_buff_start = in_buff.get();
    in_buff_end = in_buff.get();
    out_buff = std::unique_ptr<char[]>(new char[buff_size]);
    setg(out_buff.get(), out_buff.get(), out_buff.get());
  }